

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getGroupNumber(ObjFileParser *this)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  ObjFileParser *this_local;
  
  _Var1 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var1._M_current;
  return;
}

Assistant:

void ObjFileParser::getGroupNumber()
{
    // Not used

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}